

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GenericBlendersTests.cpp
# Opt level: O0

void __thiscall
agge::tests::GenericRGBXBlenderTests::GenericRGBXBlenderTests(GenericRGBXBlenderTests *this)

{
  GenericRGBXBlenderTests *this_local;
  
  ut::
  test_case_registrar<agge::tests::GenericRGBXBlenderTests,_&agge::tests::GenericRGBXBlenderTests::__BlendingWhiteOnBlackProducesGrayDependingOnCover_meta>
  ::test_case_registrar
            ((test_case_registrar<agge::tests::GenericRGBXBlenderTests,_&agge::tests::GenericRGBXBlenderTests::__BlendingWhiteOnBlackProducesGrayDependingOnCover_meta>
              *)this);
  ut::
  test_case_registrar<agge::tests::GenericRGBXBlenderTests,_&agge::tests::GenericRGBXBlenderTests::__BlendingBlackOnWhiteProducesGrayDependingOnInvertedCover_meta>
  ::test_case_registrar
            ((test_case_registrar<agge::tests::GenericRGBXBlenderTests,_&agge::tests::GenericRGBXBlenderTests::__BlendingBlackOnWhiteProducesGrayDependingOnInvertedCover_meta>
              *)&this->field_0x1);
  ut::
  test_case_registrar<agge::tests::GenericRGBXBlenderTests,_&agge::tests::GenericRGBXBlenderTests::__BlendingFullyOpaquePixelIsCopied_meta>
  ::test_case_registrar
            ((test_case_registrar<agge::tests::GenericRGBXBlenderTests,_&agge::tests::GenericRGBXBlenderTests::__BlendingFullyOpaquePixelIsCopied_meta>
              *)&this->field_0x2);
  ut::
  test_case_registrar<agge::tests::GenericRGBXBlenderTests,_&agge::tests::GenericRGBXBlenderTests::__BlendingHalfOpaquePixelIsBlended_meta>
  ::test_case_registrar
            ((test_case_registrar<agge::tests::GenericRGBXBlenderTests,_&agge::tests::GenericRGBXBlenderTests::__BlendingHalfOpaquePixelIsBlended_meta>
              *)&this->field_0x3);
  ut::
  test_case_registrar<agge::tests::GenericRGBXBlenderTests,_&agge::tests::GenericRGBXBlenderTests::__BlendingSeriesOfCoversIsSupported_meta>
  ::test_case_registrar
            ((test_case_registrar<agge::tests::GenericRGBXBlenderTests,_&agge::tests::GenericRGBXBlenderTests::__BlendingSeriesOfCoversIsSupported_meta>
              *)&this->field_0x4);
  ut::
  test_case_registrar<agge::tests::GenericRGBXBlenderTests,_&agge::tests::GenericRGBXBlenderTests::__AlphaIsMixedFromSrcAlphaAndCover_meta>
  ::test_case_registrar
            ((test_case_registrar<agge::tests::GenericRGBXBlenderTests,_&agge::tests::GenericRGBXBlenderTests::__AlphaIsMixedFromSrcAlphaAndCover_meta>
              *)&this->field_0x5);
  ut::
  test_case_registrar<agge::tests::GenericRGBXBlenderTests,_&agge::tests::GenericRGBXBlenderTests::__PixelCopyAppliesRequiredAmountOfPixels_meta>
  ::test_case_registrar
            ((test_case_registrar<agge::tests::GenericRGBXBlenderTests,_&agge::tests::GenericRGBXBlenderTests::__PixelCopyAppliesRequiredAmountOfPixels_meta>
              *)&this->field_0x6);
  ut::
  test_case_registrar<agge::tests::GenericRGBXBlenderTests,_&agge::tests::GenericRGBXBlenderTests::__PixelComponentsAreSetAccordinglyToOrderOnCopy_meta>
  ::test_case_registrar
            ((test_case_registrar<agge::tests::GenericRGBXBlenderTests,_&agge::tests::GenericRGBXBlenderTests::__PixelComponentsAreSetAccordinglyToOrderOnCopy_meta>
              *)&this->field_0x7);
  return;
}

Assistant:

test( BlendingWhiteOnBlackProducesGrayDependingOnCover )
			{
				typedef mocks::pixel_rgbx<order_rgba> pixel;

				// INIT
				const int n = 7;
				const pixel black = { };
				const uint8_t covers[n] = { 0x00, 0x12, 0x21, 0x71, 0x81, 0xF0, 0xFF };
				blender_solid_color_rgb<pixel, order_rgba> whiteness(color::make(0xFF, 0xFF, 0xFF));
				pixel dest[n];

				fill_n(dest, n, black);

				// ACT
				whiteness(dest + 0, 0, 0, 1, covers + 0);
				whiteness(dest + 1, 0, 0, 1, covers + 1);
				whiteness(dest + 2, 0, 0, 1, covers + 2);
				whiteness(dest + 3, 0, 0, 1, covers + 3);
				whiteness(dest + 4, 0, 0, 1, covers + 4);
				whiteness(dest + 5, 0, 0, 1, covers + 5);
				whiteness(dest + 6, 0, 0, 1, covers + 6);

				// ASSERT
				pixel reference[] = {
					{ { 0x00, 0x00, 0x00, 0x00 } },
					{ { 0x11, 0x11, 0x11, 0x11 } },
					{ { 0x20, 0x20, 0x20, 0x20 } },
					{ { 0x70, 0x70, 0x70, 0x70 } },
					{ { 0x80, 0x80, 0x80, 0x80 } },
					{ { 0xEF, 0xEF, 0xEF, 0xEF } },
					{ { 0xFF, 0xFF, 0xFF, 0xFF } },
				};

				assert_equal(reference, dest);
			}